

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::Transpose(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *T)

{
  int64_t iVar1;
  int64_t iVar2;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t r;
  int64_t c;
  longdouble *p;
  undefined8 local_28;
  undefined8 local_20;
  
  iVar1 = TPZBaseMatrix::Cols(in_RDI);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RSI,iVar1,iVar2);
  local_20 = 0;
  while( true ) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar1 <= local_20) break;
    local_28 = 0;
    while( true ) {
      iVar1 = TPZBaseMatrix::Rows(in_RDI);
      if (iVar1 <= local_28) break;
      (**(code **)(*in_RSI + 0x118))(in_RSI,local_20,local_28);
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Transpose(TPZMatrix<TVar> *const T) const{
    T->Resize( this->Cols(), this->Rows() );
    //Transposta por filas
    TVar * p = fElem;
    for ( int64_t c = 0; c < this->Cols(); c++ ) {
        for ( int64_t r = 0; r < this->Rows(); r++ ) {
            T->PutVal( c, r, *p++ );
            //            cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
        }
    }
}